

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O1

int run_test_barrier_3(void)

{
  int iVar1;
  undefined8 *unaff_RBX;
  undefined1 *puVar2;
  long lVar3;
  uv_thread_t thread;
  worker_config wc;
  undefined1 auStack_a0 [32];
  undefined1 auStack_80 [32];
  undefined8 *puStack_60;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  uint uStack_10;
  uint uStack_c;
  
  local_18 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  iVar1 = uv_barrier_init(&local_38,2);
  if (iVar1 == 0) {
    iVar1 = uv_thread_create(local_40,worker,&local_38);
    if (iVar1 != 0) goto LAB_0014c75d;
    unaff_RBX = &local_38;
    uStack_10 = uv_barrier_wait(unaff_RBX);
    iVar1 = uv_thread_join(local_40);
    if (iVar1 == 0) {
      unaff_RBX = &local_38;
      uv_barrier_destroy(unaff_RBX);
      if ((uStack_c ^ uStack_10) == 1) {
        return 0;
      }
      goto LAB_0014c767;
    }
  }
  else {
    run_test_barrier_3_cold_1();
LAB_0014c75d:
    run_test_barrier_3_cold_2();
  }
  run_test_barrier_3_cold_3();
LAB_0014c767:
  run_test_barrier_3_cold_4();
  puVar2 = auStack_a0;
  puStack_60 = unaff_RBX;
  iVar1 = uv_barrier_init(auStack_a0,5);
  if (iVar1 == 0) {
    lVar3 = 0;
    do {
      puVar2 = auStack_80 + lVar3;
      iVar1 = uv_thread_create(puVar2,serial_worker,auStack_a0);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_0014c7f6;
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    iVar1 = uv_barrier_wait(auStack_a0);
    if (0 < iVar1) {
      uv_barrier_destroy(auStack_a0);
    }
    lVar3 = 0;
    while( true ) {
      puVar2 = auStack_80 + lVar3;
      iVar1 = uv_thread_join(puVar2);
      if (iVar1 != 0) break;
      lVar3 = lVar3 + 8;
      if (lVar3 == 0x20) {
        return 0;
      }
    }
LAB_0014c7f6:
    run_test_barrier_serial_thread_cold_3();
  }
  run_test_barrier_serial_thread_cold_1();
  iVar1 = uv_barrier_wait();
  if (0 < iVar1) {
    uv_barrier_destroy(puVar2);
  }
  iVar1 = uv_sleep(100);
  return iVar1;
}

Assistant:

TEST_IMPL(barrier_3) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}